

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O2

float ncnn::sum_dim(vector<int,_std::allocator<int>_> *dim_sizes,int d,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *tokens,vector<int,_std::allocator<int>_> *indexes)

{
  char *pcVar1;
  long lVar2;
  pointer piVar3;
  pointer pbVar4;
  long lVar5;
  float *pfVar6;
  pointer pMVar7;
  int i;
  int iVar8;
  bool bVar9;
  float fVar10;
  float v;
  float fVar11;
  
  piVar3 = (dim_sizes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(dim_sizes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3) >> 2) == d) {
    pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar7) / 0x48;
    pbVar4 = (tokens->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (indexes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    fVar11 = 1.0;
    while (bVar9 = lVar2 != 0, lVar2 = lVar2 + -1, bVar9) {
      switch(pMVar7->dims) {
      case 1:
        pfVar6 = (float *)((long)piVar3[(long)*(pbVar4->_M_dataplus)._M_p + -0x69] * 4 +
                          (long)pMVar7->data);
        break;
      case 2:
        pcVar1 = (pbVar4->_M_dataplus)._M_p;
        pfVar6 = (float *)((long)pMVar7->data +
                          (long)piVar3[(long)pcVar1[1] + -0x69] * 4 +
                          (long)pMVar7->w * (long)piVar3[(long)*pcVar1 + -0x69] * pMVar7->elemsize);
        break;
      case 3:
        pcVar1 = (pbVar4->_M_dataplus)._M_p;
        pfVar6 = (float *)((long)pMVar7->data +
                          (long)piVar3[(long)pcVar1[2] + -0x69] * 4 +
                          (long)pMVar7->w * pMVar7->elemsize * (long)piVar3[(long)pcVar1[1] + -0x69]
                          + (long)piVar3[(long)*pcVar1 + -0x69] * pMVar7->cstep * pMVar7->elemsize);
        break;
      case 4:
        pcVar1 = (pbVar4->_M_dataplus)._M_p;
        lVar5 = (long)pMVar7->w * pMVar7->elemsize;
        pfVar6 = (float *)((long)pMVar7->data +
                          (long)piVar3[(long)pcVar1[3] + -0x69] * 4 +
                          lVar5 * piVar3[(long)pcVar1[2] + -0x69] +
                          pMVar7->h * lVar5 * (long)piVar3[(long)pcVar1[1] + -0x69] +
                          (long)piVar3[(long)*pcVar1 + -0x69] * pMVar7->cstep * pMVar7->elemsize);
        break;
      default:
        fVar10 = 0.0;
        goto LAB_004f5303;
      }
      fVar10 = *pfVar6;
LAB_004f5303:
      fVar11 = fVar11 * fVar10;
      pbVar4 = pbVar4 + 1;
      pMVar7 = pMVar7 + 1;
    }
  }
  else {
    fVar11 = 0.0;
    for (iVar8 = 0; iVar8 < piVar3[d]; iVar8 = iVar8 + 1) {
      (indexes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[d] = iVar8;
      fVar10 = sum_dim(dim_sizes,d + 1,bottom_blobs,tokens,indexes);
      fVar11 = fVar11 + fVar10;
      piVar3 = (dim_sizes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  return fVar11;
}

Assistant:

static float sum_dim(const std::vector<int>& dim_sizes, int d, const std::vector<Mat>& bottom_blobs, const std::vector<std::string>& tokens, std::vector<int>& indexes)
{
    if (d == (int)dim_sizes.size())
    {
        float v = 1.f;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            v *= get_indexed_value(bottom_blobs[b], tokens[b], indexes);
        }

        return v;
    }

    float sum = 0.f;

    for (int i = 0; i < dim_sizes[d]; i++)
    {
        indexes[d] = i;

        sum += sum_dim(dim_sizes, d + 1, bottom_blobs, tokens, indexes);
    }

    return sum;
}